

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APInt __thiscall llvm::detail::IEEEFloat::convertDoubleAPFloatToAPInt(IEEEFloat *this)

{
  bool bVar1;
  uint uVar2;
  integerPart *piVar3;
  undefined8 extraout_RDX;
  IEEEFloat *in_RSI;
  APInt AVar4;
  ulong local_28;
  uint64_t mysignificand;
  uint64_t myexponent;
  IEEEFloat *this_local;
  
  if (in_RSI->semantics != (fltSemantics *)semIEEEdouble) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEdouble",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb61,"APInt llvm::detail::IEEEFloat::convertDoubleAPFloatToAPInt() const");
  }
  uVar2 = partCount(in_RSI);
  if (uVar2 == 1) {
    bVar1 = isFiniteNonZero(in_RSI);
    if (bVar1) {
      mysignificand = (uint64_t)(in_RSI->exponent + 0x3ff);
      piVar3 = significandParts(in_RSI);
      local_28 = *piVar3;
      if ((mysignificand == 1) && ((local_28 & 0x10000000000000) == 0)) {
        mysignificand = 0;
      }
    }
    else if ((in_RSI->field_0x12 & 7) == 3) {
      mysignificand = 0;
      local_28 = 0;
    }
    else {
      if ((in_RSI->field_0x12 & 7) == 0) {
        local_28 = 0;
      }
      else {
        if ((in_RSI->field_0x12 & 7) != 1) {
          __assert_fail("category == fcNaN && \"Unknown category!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xb72,"APInt llvm::detail::IEEEFloat::convertDoubleAPFloatToAPInt() const")
          ;
        }
        piVar3 = significandParts(in_RSI);
        local_28 = *piVar3;
      }
      mysignificand = 0x7ff;
    }
    APInt::APInt((APInt *)this,0x40,
                 (long)(int)(uint)((byte)in_RSI->field_0x12 >> 3 & 1) << 0x3f |
                 (mysignificand & 0x7ff) << 0x34 | local_28 & 0xfffffffffffff,false);
    AVar4._8_8_ = extraout_RDX;
    AVar4.U.pVal = (uint64_t *)this;
    return AVar4;
  }
  __assert_fail("partCount()==1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xb62,"APInt llvm::detail::IEEEFloat::convertDoubleAPFloatToAPInt() const");
}

Assistant:

APInt IEEEFloat::convertDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEdouble);
  assert(partCount()==1);

  uint64_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+1023; //bias
    mysignificand = *significandParts();
    if (myexponent==1 && !(mysignificand & 0x10000000000000LL))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x7ff;
    mysignificand = 0;
  } else {
    assert(category == fcNaN && "Unknown category!");
    myexponent = 0x7ff;
    mysignificand = *significandParts();
  }

  return APInt(64, ((((uint64_t)(sign & 1) << 63) |
                     ((myexponent & 0x7ff) <<  52) |
                     (mysignificand & 0xfffffffffffffLL))));
}